

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O0

string * __thiscall
despot::AdventurerState::text_abi_cxx11_(string *__return_storage_ptr__,AdventurerState *this)

{
  string local_a8;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  AdventurerState *local_18;
  AdventurerState *this_local;
  
  local_18 = this;
  this_local = (AdventurerState *)__return_storage_ptr__;
  to_string<int>(&local_78,*(int *)&this->field_0xc);
  std::operator+(&local_58,"s",&local_78);
  std::operator+(&local_38,&local_58,"-");
  to_string<int>(&local_a8,*(int *)&this->field_0xc / *(int *)(Adventurer::current_ + 0x50));
  std::operator+(__return_storage_ptr__,&local_38,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

string AdventurerState::text() const {
	return "s" + to_string(state_id) + "-" + to_string(state_id / Adventurer::current_->size_);
}